

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_facade.cpp
# Opt level: O1

string * __thiscall
license::hw_identifier::HwIdentifierFacade::generate_user_pc_signature_abi_cxx11_
          (string *__return_storage_ptr__,HwIdentifierFacade *this,
          LCC_API_HW_IDENTIFICATION_STRATEGY strategy)

{
  int iVar1;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy_00;
  char *__nptr;
  int *piVar2;
  logic_error *this_00;
  long *plVar3;
  long *plVar4;
  pointer *__ptr;
  bool use_env_var;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar6;
  unique_ptr<license::hw_identifier::IdentificationStrategy,_std::default_delete<license::hw_identifier::IdentificationStrategy>_>
  strategy_ptr;
  HwIdentifier pc_id;
  IdentificationStrategy local_98;
  HwIdentifier local_90;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  strategy_00 = (LCC_API_HW_IDENTIFICATION_STRATEGY)this;
  if (strategy_00 == STRATEGY_DEFAULT) {
    __nptr = getenv("IDENTIFICATION_STRATEGY");
    strategy_00 = STRATEGY_DEFAULT;
    if ((__nptr != (char *)0x0) && (*__nptr != '\0')) {
      strategy_00 = atoi(__nptr);
      use_env_var = (uint)strategy_00 < 4;
      if (!use_env_var) {
        piVar2 = __errno_location();
        uVar5 = extraout_XMM0_Da;
        uVar6 = extraout_XMM0_Db;
        if (*piVar2 != 0) {
          strerror(*piVar2);
          uVar5 = extraout_XMM0_Da_00;
          uVar6 = extraout_XMM0_Db_00;
        }
        use_env_var = false;
        _log((double)CONCAT44(uVar6,uVar5));
        strategy_00 = STRATEGY_DEFAULT;
      }
      goto LAB_001898bd;
    }
  }
  use_env_var = false;
LAB_001898bd:
  IdentificationStrategy::get_strategy(&local_98,strategy_00);
  HwIdentifier::HwIdentifier(&local_90);
  iVar1 = (**(code **)(*local_98._vptr_IdentificationStrategy + 0x18))
                    (local_98._vptr_IdentificationStrategy,&local_90);
  HwIdentifier::set_use_environment_var(&local_90,use_env_var);
  if (iVar1 != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    iVar1 = (**(code **)(*local_98._vptr_IdentificationStrategy + 0x10))();
    std::__cxx11::to_string(&local_60,iVar1);
    std::operator+(&local_40,"strategy ",&local_60);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_80 = (long *)*plVar3;
    plVar4 = plVar3 + 2;
    if (local_80 == plVar4) {
      local_70 = *plVar4;
      lStack_68 = plVar3[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar4;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_80);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  HwIdentifier::print_abi_cxx11_(__return_storage_ptr__,&local_90);
  HwIdentifier::~HwIdentifier(&local_90);
  if (local_98._vptr_IdentificationStrategy != (_func_int **)0x0) {
    (**(code **)(*local_98._vptr_IdentificationStrategy + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HwIdentifierFacade::generate_user_pc_signature(LCC_API_HW_IDENTIFICATION_STRATEGY strategy) {
	bool use_env_var = false;
	vector<LCC_API_HW_IDENTIFICATION_STRATEGY> strategies_to_try;
	if (strategy == STRATEGY_DEFAULT) {
		char* env_var_value = getenv(LCC_IDENTIFICATION_STRATEGY_ENV_VAR);
		if (env_var_value != nullptr && env_var_value[0] != '\0') {
			int strategy_int = atoi(env_var_value);
			if (strategy_int < 0 || strategy_int > 3) {
				LOG_WARN("unknown " LCC_IDENTIFICATION_STRATEGY_ENV_VAR " %s", env_var_value);
			} else {
				strategy = (LCC_API_HW_IDENTIFICATION_STRATEGY)strategy_int;
				use_env_var = true;
			}
		}
	}

	unique_ptr<IdentificationStrategy> strategy_ptr = IdentificationStrategy::get_strategy(strategy);
	HwIdentifier pc_id;
	FUNCTION_RETURN result = strategy_ptr->generate_pc_id(pc_id);
	pc_id.set_use_environment_var(use_env_var);
	if (result != FUNC_RET_OK) {
		throw logic_error("strategy " + to_string(strategy_ptr->identification_strategy()) + " failed");
	}
	return pc_id.print();
}